

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testwidgets.cpp
# Opt level: O3

void set_look_proc(Am_Object *cmd)

{
  Am_Value *pAVar1;
  long *plVar2;
  Am_Value my_look;
  float local_1c;
  Am_Value local_18;
  
  pAVar1 = (Am_Value *)Am_Object::Get((ushort)cmd,0x17f);
  Am_Value::Am_Value(&local_18,pAVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Setting look to ",0x10);
  plVar2 = (long *)operator<<((ostream *)&std::cout,&local_18);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::ostream::flush();
  local_1c = 0.0;
  if ((local_18.type != 1) && (local_18.type != (Am_Value_Type)Am_Widget_Look::Am_Widget_Look_ID)) {
    Am_Widget_Look::TypeError((Am_Value *)&local_1c);
  }
  local_1c = local_18.value.float_value;
  Am_Set_Default_Look((Am_Widget_Look)local_18.value.float_value);
  Am_Value::~Am_Value(&local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, set_look, (Am_Object cmd))
{
  Am_Value my_look = cmd.Get(Am_WIDGET_LOOK);
  std::cout << "Setting look to " << my_look << std::endl << std::flush;
  Am_Set_Default_Look(my_look);
}